

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O1

bool asmjit::v1_14::x86::x86ShouldUseMovabs
               (Assembler *self,X86BufferWriter *writer,uint32_t regSize,InstOptions options,
               Mem *rmRel)

{
  uint64_t uVar1;
  uint8_t *puVar2;
  _func_int **pp_Var3;
  byte bVar4;
  Error err;
  Error extraout_EAX;
  Error EVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  _func_int *p_Var9;
  int iVar10;
  uint extraout_EDX;
  ulong extraout_RDX;
  uint8_t *puVar11;
  void *__s;
  undefined1 *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  undefined8 uStack_e8;
  ulong uStack_e0;
  undefined8 uStack_d8;
  undefined1 *puStack_d0;
  undefined1 auStack_c8 [136];
  ulong uStack_40;
  
  if (((self->super_BaseAssembler).super_BaseEmitter._environment._arch & k32BitMask) != kUnknown) {
    return (options & (kX86_ModRM|kX86_ModMR)) == kNone;
  }
  uVar8 = (rmRel->super_BaseMem).super_Operand.super_Operand_._signature._bits;
  uVar13 = uVar8 >> 0xe & 3;
  if ((options & (kX86_ModRM|kX86_ModMR)) == kNone && uVar13 != 2) {
    uVar14 = (rmRel->super_BaseMem).super_Operand.super_Operand_._data[1];
    uVar15 = (ulong)uVar14;
    uVar6 = CONCAT44((rmRel->super_BaseMem).super_Operand.super_Operand_._baseId,uVar14);
    if ((uVar8 & 0xf8) != 0) {
      uVar6 = (long)(int)uVar14;
    }
    uVar1 = ((self->super_BaseAssembler).super_BaseEmitter._code)->_baseAddress;
    if ((uVar13 == 0 && (uVar8 & 0x1c0000) == 0) && uVar1 != 0xffffffffffffffff) {
      puVar2 = (self->super_BaseAssembler)._bufferData;
      puVar11 = (writer->super_CodeWriter)._cursor;
      if (puVar11 < puVar2) {
        x86ShouldUseMovabs((x86 *)self);
        uVar8 = (uint)puVar11;
        if (uVar8 < 8) {
          if (extraout_EDX < 8) {
            return (bool)((char)self * '@' + (char)puVar11 * '\b' | (byte)extraout_EDX);
          }
        }
        else {
          x86EncodeMod((x86 *)self);
        }
        x86EncodeMod((x86 *)self);
        uStack_40 = uVar15;
        if (((BaseEmitter *)self)->_code == (CodeHolder *)0x0) {
          EVar5 = 5;
        }
        else {
          uVar6 = (ulong)uVar8;
          if ((byte)uVar8 < 3) {
            uVar8 = (uint)extraout_RDX;
            EVar5 = 0;
            if (uVar8 < 2) {
LAB_00142be0:
              return SUB41(EVar5,0);
            }
            if ((uVar8 < 0x41) &&
               (uVar8 = uVar8 - ((uint)(extraout_RDX >> 1) & 0x55555555),
               uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333),
               ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
              __s = (void *)((BaseEmitter *)((long)self + 0x90))->_archMask;
              lVar7 = (long)__s - *(long *)&((BaseEmitter *)((long)self + 0x90))->_emitterType;
              uVar15 = (-(extraout_RDX & 0xffffffff) &
                       (extraout_RDX & 0xffffffff) + 0xffffffff + lVar7) - lVar7;
              if ((int)uVar15 == 0) {
LAB_00142b47:
                EVar5 = 0;
                if (((BaseEmitter *)self)->_logger != (Logger *)0x0) {
                  puStack_d0 = auStack_c8;
                  uStack_e0 = 0;
                  uStack_e8 = 0x20;
                  uStack_d8 = 0x87;
                  auStack_c8[0] = 0;
                  String::_opChars((String *)&uStack_e8,kAppend,' ',
                                   (ulong)(((BaseEmitter *)self)->_logger->_options)._indentation.
                                          _data[0]);
                  EVar5 = 0;
                  String::_opFormat((String *)&uStack_e8,kAppend,"align %u\n",
                                    extraout_RDX & 0xffffffff);
                  uVar6 = uStack_e0;
                  puVar12 = puStack_d0;
                  if ((uStack_e8 & 0xff) < 0x1f) {
                    uVar6 = uStack_e8 & 0xff;
                    puVar12 = (undefined1 *)((long)&uStack_e8 + 1);
                  }
                  (*((BaseEmitter *)self)->_logger->_vptr_Logger[2])
                            (((BaseEmitter *)self)->_logger,puVar12,uVar6);
                  String::reset((String *)&uStack_e8);
                }
              }
              else {
                EVar5 = 0;
                if ((ulong)(*(long *)&((BaseEmitter *)((long)self + 0x90))->_diagnosticOptions -
                           (long)__s) < (uVar15 & 0xffffffff)) {
                  err = CodeHolder::growBuffer
                                  (((BaseEmitter *)self)->_code,
                                   (CodeBuffer *)
                                   (((BaseEmitter *)((long)self + 0x90))->_vptr_BaseEmitter + 9),
                                   uVar15 & 0xffffffff);
                  if (err != 0) goto LAB_00142c4a;
                  __s = (void *)((BaseEmitter *)((long)self + 0x90))->_archMask;
                  EVar5 = 0;
                  goto LAB_00142c3a;
                }
                while (EVar5 == 0) {
                  if ((char)uVar6 == '\x01') {
                    bVar4 = 0xcc;
                  }
                  else if ((uVar6 & 0xff) == 0) {
                    bVar4 = 0x90;
                    if ((((BaseEmitter *)self)->_encodingOptions & kOptimizedAlign) != kNone) {
                      do {
                        pvVar16 = __s;
                        uVar13 = (uint)uVar15;
                        uVar8 = 9;
                        if (uVar13 < 9) {
                          uVar8 = uVar13;
                        }
                        uVar14 = uVar13;
                        if (8 < (uVar15 & 0xffffffff)) {
                          uVar14 = 9;
                        }
                        lVar7 = 0;
                        do {
                          *(uint8_t *)((long)pvVar16 + lVar7) =
                               Assembler::align::nopData[uVar8 - 1][lVar7];
                          lVar7 = lVar7 + 1;
                        } while (uVar14 != (uint)lVar7);
                        uVar15 = (ulong)(uVar13 - uVar8);
                        __s = (void *)((long)pvVar16 + lVar7);
                      } while (uVar13 - uVar8 != 0);
                      __s = (void *)((long)pvVar16 + lVar7);
                    }
                  }
                  else {
                    bVar4 = 0;
                  }
                  if ((int)uVar15 != 0) {
                    uVar6 = uVar15 & 0xffffffff;
                    memset(__s,(uint)bVar4,uVar6);
                    __s = (void *)((long)__s + uVar6);
                  }
                  pp_Var3 = ((BaseEmitter *)((long)self + 0x90))->_vptr_BaseEmitter;
                  p_Var9 = (_func_int *)
                           ((long)__s - *(long *)&((BaseEmitter *)((long)self + 0x90))->_emitterType
                           );
                  if (p_Var9 <= pp_Var3[0xb]) {
                    ((BaseEmitter *)((long)self + 0x90))->_archMask = (uint64_t)__s;
                    if (p_Var9 < pp_Var3[10]) {
                      p_Var9 = pp_Var3[10];
                    }
                    pp_Var3[10] = p_Var9;
                    goto LAB_00142b47;
                  }
                  Assembler::align();
                  err = extraout_EAX;
LAB_00142c4a:
                  EVar5 = BaseEmitter::reportError((BaseEmitter *)self,err,(char *)0x0);
LAB_00142c3a:
                  if (err == 0) {
                    EVar5 = 0;
                  }
                }
              }
              goto LAB_00142be0;
            }
          }
          EVar5 = 2;
        }
        EVar5 = BaseEmitter::reportError((BaseEmitter *)self,EVar5,(char *)0x0);
        return SUB41(EVar5,0);
      }
      iVar10 = -1;
      if (regSize != 8) {
        iVar10 = (int)(options * 2) >> 0x1f;
      }
      if ((ulong)(puVar2 + ((uVar6 + (iVar10 + (regSize == 2 ^ 0xfffffff7) + 0x80000000)) -
                           (long)(puVar11 + ((self->super_BaseAssembler)._section)->_offset + uVar1)
                           )) >> 0x20 != 0) goto LAB_00142987;
    }
    else if ((long)(int)uVar6 != uVar6) {
LAB_00142987:
      return uVar6 >> 0x20 != 0;
    }
  }
  return false;
}

Assistant:

static ASMJIT_FORCE_INLINE bool x86ShouldUseMovabs(Assembler* self, X86BufferWriter& writer, uint32_t regSize, InstOptions options, const Mem& rmRel) noexcept {
  if (self->is32Bit()) {
    // There is no relative addressing, just decide whether to use MOV encoded with MOD R/M or absolute.
    return !Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM);
  }
  else {
    // If the addressing type is REL or MOD R/M was specified then absolute mov won't be used.
    if (rmRel.addrType() == Mem::AddrType::kRel || Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM))
      return false;

    int64_t addrValue = rmRel.offset();
    uint64_t baseAddress = self->code()->baseAddress();

    // If the address type is default, it means to basically check whether relative addressing is possible. However,
    // this is only possible when the base address is known - relative encoding uses RIP+N it has to be calculated.
    if (rmRel.addrType() == Mem::AddrType::kDefault && baseAddress != Globals::kNoBaseAddress && !rmRel.hasSegment()) {
      uint32_t instructionSize = x86GetMovAbsInstSize64Bit(regSize, options, rmRel);
      uint64_t virtualOffset = uint64_t(writer.offsetFrom(self->_bufferData));
      uint64_t rip64 = baseAddress + self->_section->offset() + virtualOffset + instructionSize;
      uint64_t rel64 = uint64_t(addrValue) - rip64;

      if (Support::isInt32(int64_t(rel64)))
        return false;
    }
    else {
      if (Support::isInt32(addrValue))
        return false;
    }

    return uint64_t(addrValue) > 0xFFFFFFFFu;
  }
}